

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O1

ngx_int_t ngx_http_variable_request
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  if (*(long *)((long)&r->connection + data) == 0) {
    v->field_0x3 = v->field_0x3 | 0x40;
  }
  else {
    *(uint *)v = (*(uint *)((long)&r->signature + data) & 0xfffffff) + (*(uint *)v & 0x80000000) +
                 0x10000000;
    v->data = *(u_char **)((long)&r->connection + data);
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_request(ngx_http_request_t *r, ngx_http_variable_value_t *v,
    uintptr_t data)
{
    ngx_str_t  *s;

    s = (ngx_str_t *) ((char *) r + data);

    if (s->data) {
        v->len = s->len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = s->data;

    } else {
        v->not_found = 1;
    }

    return NGX_OK;
}